

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth2-client.c
# Opt level: O3

PacketProtocolLayer *
ssh2_userauth_new(PacketProtocolLayer *successor_layer,char *hostname,char *fullhostname,
                 Filename *keyfile,Filename *detached_cert_file,_Bool show_banner,_Bool tryagent,
                 _Bool notrivialauth,char *default_username,_Bool change_username,_Bool try_ki_auth,
                 _Bool try_gssapi_auth,_Bool try_gssapi_kex_auth,_Bool gssapi_fwd,
                 ssh_connection_shared_gss_state *shgss)

{
  void *__s;
  char *pcVar1;
  Filename *pFVar2;
  strbuf *psVar3;
  
  __s = safemalloc(1,0x2b0,0);
  memset(__s,0,0x2b0);
  *(PacketProtocolLayerVtable **)((long)__s + 0x248) = &ssh2_userauth_vtable;
  *(PacketProtocolLayer **)((long)__s + 0x10) = successor_layer;
  pcVar1 = dupstr(hostname);
  *(char **)((long)__s + 0x30) = pcVar1;
  pcVar1 = dupstr(fullhostname);
  *(char **)((long)__s + 0x38) = pcVar1;
  pFVar2 = filename_copy(keyfile);
  *(Filename **)((long)__s + 0x18) = pFVar2;
  pFVar2 = filename_copy(detached_cert_file);
  *(Filename **)((long)__s + 0x20) = pFVar2;
  *(_Bool *)((long)__s + 0x28) = show_banner;
  *(_Bool *)((long)__s + 0x29) = tryagent;
  *(_Bool *)((long)__s + 0x2a) = notrivialauth;
  pcVar1 = dupstr(default_username);
  *(char **)((long)__s + 0x40) = pcVar1;
  *(_Bool *)((long)__s + 0x2b) = change_username;
  *(_Bool *)((long)__s + 0x48) = try_ki_auth;
  *(_Bool *)((long)__s + 0x49) = try_gssapi_auth;
  *(_Bool *)((long)__s + 0x4a) = try_gssapi_kex_auth;
  *(_Bool *)((long)__s + 0x4b) = gssapi_fwd;
  *(ssh_connection_shared_gss_state **)((long)__s + 0x90) = shgss;
  psVar3 = strbuf_new();
  *(strbuf **)((long)__s + 0xe0) = psVar3;
  *(undefined1 *)((long)__s + 0x1d0) = 1;
  bufchain_init((bufchain *)((long)__s + 0x1e0));
  bufchain_sink_init((bufchain_sink *)((long)__s + 0x208),(bufchain *)((long)__s + 0x1e0));
  return (PacketProtocolLayer *)((long)__s + 0x248);
}

Assistant:

PacketProtocolLayer *ssh2_userauth_new(
    PacketProtocolLayer *successor_layer,
    const char *hostname, const char *fullhostname,
    Filename *keyfile, Filename *detached_cert_file,
    bool show_banner, bool tryagent, bool notrivialauth,
    const char *default_username, bool change_username,
    bool try_ki_auth, bool try_gssapi_auth, bool try_gssapi_kex_auth,
    bool gssapi_fwd, struct ssh_connection_shared_gss_state *shgss)
{
    struct ssh2_userauth_state *s = snew(struct ssh2_userauth_state);
    memset(s, 0, sizeof(*s));
    s->ppl.vt = &ssh2_userauth_vtable;

    s->successor_layer = successor_layer;
    s->hostname = dupstr(hostname);
    s->fullhostname = dupstr(fullhostname);
    s->keyfile = filename_copy(keyfile);
    s->detached_cert_file = filename_copy(detached_cert_file);
    s->show_banner = show_banner;
    s->tryagent = tryagent;
    s->notrivialauth = notrivialauth;
    s->default_username = dupstr(default_username);
    s->change_username = change_username;
    s->try_ki_auth = try_ki_auth;
    s->try_gssapi_auth = try_gssapi_auth;
    s->try_gssapi_kex_auth = try_gssapi_kex_auth;
    s->gssapi_fwd = gssapi_fwd;
    s->shgss = shgss;
    s->last_methods_string = strbuf_new();
    s->is_trivial_auth = true;
    bufchain_init(&s->banner);
    bufchain_sink_init(&s->banner_bs, &s->banner);

    return &s->ppl;
}